

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int compression_code_copy(archive *a,la_zstream *lastrm,la_zaction action)

{
  int iVar1;
  ulong __n;
  
  __n = lastrm->avail_in;
  if (lastrm->avail_out < lastrm->avail_in) {
    __n = lastrm->avail_out;
  }
  if (__n != 0) {
    memcpy(lastrm->next_out,lastrm->next_in,__n);
    lastrm->next_in = lastrm->next_in + __n;
    lastrm->avail_in = lastrm->avail_in - __n;
    lastrm->total_in = lastrm->total_in + __n;
    lastrm->next_out = lastrm->next_out + __n;
    lastrm->avail_out = lastrm->avail_out - __n;
    lastrm->total_out = lastrm->total_out + __n;
  }
  if ((action == ARCHIVE_Z_FINISH) && (lastrm->avail_in == 0)) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
compression_code_copy(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	size_t bytes;

	(void)a; /* UNUSED */
	if (lastrm->avail_out > lastrm->avail_in)
		bytes = lastrm->avail_in;
	else
		bytes = lastrm->avail_out;
	if (bytes) {
		memcpy(lastrm->next_out, lastrm->next_in, bytes);
		lastrm->next_in += bytes;
		lastrm->avail_in -= bytes;
		lastrm->total_in += bytes;
		lastrm->next_out += bytes;
		lastrm->avail_out -= bytes;
		lastrm->total_out += bytes;
	}
	if (action == ARCHIVE_Z_FINISH && lastrm->avail_in == 0)
		return (ARCHIVE_EOF);
	return (ARCHIVE_OK);
}